

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O2

int tlp_calculate_lstdw(uintptr_t addr,size_t count)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = count + addr;
  uVar3 = (count - 4) + addr;
  if ((uVar1 & 3) != 0) {
    uVar3 = uVar1 & 0xfffffffffffffffc;
  }
  uVar4 = addr + 4;
  if ((addr & 0xfffffffffffffffc) < uVar3) {
    uVar4 = uVar3;
  }
  uVar2 = 0;
  if (uVar4 <= uVar1) {
    uVar2 = ~(0xf << ((char)uVar1 - (char)uVar4 & 0x1fU)) & 0xf;
  }
  return uVar2;
}

Assistant:

int tlp_calculate_lstdw(uintptr_t addr, size_t count)
{
	uintptr_t end, end_start, start;

	start = (addr >> 2) << 2;
	end = addr + count;
	if ((end & 0x3) == 0)
		end_start = end - 4;
	else
		end_start = (end >> 2) << 2;

	/* corner case. count is smaller than 8 */
	if (end_start <= start)
		end_start = addr + 4;
	if (end < end_start)
		return 0;

	return ~(0xF << (end - end_start)) & 0xF;
}